

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_data_proc_3src(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  bool bVar1;
  uint32_t reg;
  uint32_t reg_00;
  uint32_t reg_01;
  uint32_t reg_02;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint value;
  TCGv_i64 pTVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 pTVar7;
  TCGv_i64 pTVar8;
  TCGv_i64 pTVar9;
  TCGv_i64 tcg_rm;
  TCGv_i64 tcg_rn;
  TCGv_i64 tcg_rd;
  TCGv_i64 low_bits;
  TCGv_i64 tcg_tmp;
  TCGv_i64 tcg_op2;
  TCGv_i64 tcg_op1;
  _Bool is_signed;
  _Bool is_high;
  _Bool is_sub;
  _Bool sf;
  int op_id;
  int rm;
  int ra;
  int rn;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  reg = extract32(insn,0,5);
  reg_00 = extract32(insn,5,5);
  reg_01 = extract32(insn,10,5);
  reg_02 = extract32(insn,0x10,5);
  uVar2 = extract32(insn,0x1d,3);
  uVar3 = extract32(insn,0x15,3);
  uVar4 = extract32(insn,0xf,1);
  value = uVar2 << 4 | uVar3 * 2 | uVar4;
  uVar2 = extract32(insn,0x1f,1);
  uVar3 = extract32(value,0,1);
  uVar4 = extract32(value,2,1);
  bVar1 = false;
  switch(value) {
  case 0:
  case 1:
  case 0x40:
  case 0x41:
  case 0x4a:
  case 0x4b:
  case 0x4c:
    break;
  default:
    unallocated_encoding_aarch64(s);
    return;
  case 0x42:
  case 0x43:
  case 0x44:
    bVar1 = true;
  }
  if (uVar4 == 0) {
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar7 = tcg_temp_new_i64(tcg_ctx_00);
    if ((int)value < 0x42) {
      pTVar8 = cpu_reg_aarch64(s,reg_00);
      tcg_gen_mov_i64_aarch64(tcg_ctx_00,pTVar5,pTVar8);
      pTVar8 = cpu_reg_aarch64(s,reg_02);
      tcg_gen_mov_i64_aarch64(tcg_ctx_00,pTVar6,pTVar8);
    }
    else if (bVar1) {
      pTVar8 = cpu_reg_aarch64(s,reg_00);
      tcg_gen_ext32s_i64_aarch64(tcg_ctx_00,pTVar5,pTVar8);
      pTVar8 = cpu_reg_aarch64(s,reg_02);
      tcg_gen_ext32s_i64_aarch64(tcg_ctx_00,pTVar6,pTVar8);
    }
    else {
      pTVar8 = cpu_reg_aarch64(s,reg_00);
      tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,pTVar5,pTVar8);
      pTVar8 = cpu_reg_aarch64(s,reg_02);
      tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,pTVar6,pTVar8);
    }
    if ((reg_01 != 0x1f) || (uVar3 != 0)) {
      tcg_gen_mul_i64_aarch64(tcg_ctx_00,pTVar7,pTVar5,pTVar6);
      if (uVar3 != 0) {
        pTVar8 = cpu_reg_aarch64(s,reg);
        pTVar9 = cpu_reg_aarch64(s,reg_01);
        tcg_gen_sub_i64(tcg_ctx_00,pTVar8,pTVar9,pTVar7);
      }
      else {
        pTVar8 = cpu_reg_aarch64(s,reg);
        pTVar9 = cpu_reg_aarch64(s,reg_01);
        tcg_gen_add_i64(tcg_ctx_00,pTVar8,pTVar9,pTVar7);
      }
    }
    else {
      pTVar8 = cpu_reg_aarch64(s,reg);
      tcg_gen_mul_i64_aarch64(tcg_ctx_00,pTVar8,pTVar5,pTVar6);
    }
    if (uVar2 == 0) {
      pTVar8 = cpu_reg_aarch64(s,reg);
      pTVar9 = cpu_reg_aarch64(s,reg);
      tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,pTVar8,pTVar9);
    }
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
    tcg_temp_free_i64(tcg_ctx_00,pTVar6);
    tcg_temp_free_i64(tcg_ctx_00,pTVar7);
  }
  else {
    pTVar5 = tcg_temp_new_i64(tcg_ctx_00);
    pTVar6 = cpu_reg_aarch64(s,reg);
    pTVar7 = cpu_reg_aarch64(s,reg_00);
    pTVar8 = cpu_reg_aarch64(s,reg_02);
    if (bVar1) {
      tcg_gen_muls2_i64_aarch64(tcg_ctx_00,pTVar5,pTVar6,pTVar7,pTVar8);
    }
    else {
      tcg_gen_mulu2_i64_aarch64(tcg_ctx_00,pTVar5,pTVar6,pTVar7,pTVar8);
    }
    tcg_temp_free_i64(tcg_ctx_00,pTVar5);
  }
  return;
}

Assistant:

static void disas_data_proc_3src(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int ra = extract32(insn, 10, 5);
    int rm = extract32(insn, 16, 5);
    int op_id = (extract32(insn, 29, 3) << 4) |
        (extract32(insn, 21, 3) << 1) |
        extract32(insn, 15, 1);
    bool sf = extract32(insn, 31, 1);
    bool is_sub = extract32(op_id, 0, 1);
    bool is_high = extract32(op_id, 2, 1);
    bool is_signed = false;
    TCGv_i64 tcg_op1;
    TCGv_i64 tcg_op2;
    TCGv_i64 tcg_tmp;

    /* Note that op_id is sf:op54:op31:o0 so it includes the 32/64 size flag */
    switch (op_id) {
    case 0x42: /* SMADDL */
    case 0x43: /* SMSUBL */
    case 0x44: /* SMULH */
        is_signed = true;
        break;
    case 0x0: /* MADD (32bit) */
    case 0x1: /* MSUB (32bit) */
    case 0x40: /* MADD (64bit) */
    case 0x41: /* MSUB (64bit) */
    case 0x4a: /* UMADDL */
    case 0x4b: /* UMSUBL */
    case 0x4c: /* UMULH */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (is_high) {
        TCGv_i64 low_bits = tcg_temp_new_i64(tcg_ctx); /* low bits discarded */
        TCGv_i64 tcg_rd = cpu_reg(s, rd);
        TCGv_i64 tcg_rn = cpu_reg(s, rn);
        TCGv_i64 tcg_rm = cpu_reg(s, rm);

        if (is_signed) {
            tcg_gen_muls2_i64(tcg_ctx, low_bits, tcg_rd, tcg_rn, tcg_rm);
        } else {
            tcg_gen_mulu2_i64(tcg_ctx, low_bits, tcg_rd, tcg_rn, tcg_rm);
        }

        tcg_temp_free_i64(tcg_ctx, low_bits);
        return;
    }

    tcg_op1 = tcg_temp_new_i64(tcg_ctx);
    tcg_op2 = tcg_temp_new_i64(tcg_ctx);
    tcg_tmp = tcg_temp_new_i64(tcg_ctx);

    if (op_id < 0x42) {
        tcg_gen_mov_i64(tcg_ctx, tcg_op1, cpu_reg(s, rn));
        tcg_gen_mov_i64(tcg_ctx, tcg_op2, cpu_reg(s, rm));
    } else {
        if (is_signed) {
            tcg_gen_ext32s_i64(tcg_ctx, tcg_op1, cpu_reg(s, rn));
            tcg_gen_ext32s_i64(tcg_ctx, tcg_op2, cpu_reg(s, rm));
        } else {
            tcg_gen_ext32u_i64(tcg_ctx, tcg_op1, cpu_reg(s, rn));
            tcg_gen_ext32u_i64(tcg_ctx, tcg_op2, cpu_reg(s, rm));
        }
    }

    if (ra == 31 && !is_sub) {
        /* Special-case MADD with rA == XZR; it is the standard MUL alias */
        tcg_gen_mul_i64(tcg_ctx, cpu_reg(s, rd), tcg_op1, tcg_op2);
    } else {
        tcg_gen_mul_i64(tcg_ctx, tcg_tmp, tcg_op1, tcg_op2);
        if (is_sub) {
            tcg_gen_sub_i64(tcg_ctx, cpu_reg(s, rd), cpu_reg(s, ra), tcg_tmp);
        } else {
            tcg_gen_add_i64(tcg_ctx, cpu_reg(s, rd), cpu_reg(s, ra), tcg_tmp);
        }
    }

    if (!sf) {
        tcg_gen_ext32u_i64(tcg_ctx, cpu_reg(s, rd), cpu_reg(s, rd));
    }

    tcg_temp_free_i64(tcg_ctx, tcg_op1);
    tcg_temp_free_i64(tcg_ctx, tcg_op2);
    tcg_temp_free_i64(tcg_ctx, tcg_tmp);
}